

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::iterate(HEkkPrimal *this)

{
  HEkk *pHVar1;
  HighsDebugStatus HVar2;
  bool bVar3;
  allocator local_39;
  string local_38;
  
  pHVar1 = this->ekk_instance_;
  if ((pHVar1->debug_solve_report_ == true) &&
     (bVar3 = pHVar1->iteration_count_ - 0xfU < 0xb, pHVar1->debug_iteration_report_ = bVar3, bVar3)
     ) {
    printf("HEkkDual::iterate Debug iteration %d\n");
  }
  std::__cxx11::string::string((string *)&local_38,"Before iteration",&local_39);
  HVar2 = debugPrimalSimplex(this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  if (HVar2 == kLogicalError) {
LAB_00344e9d:
    this->solve_phase = -3;
  }
  else {
    this->row_out = -2;
    chuzc(this);
    if (this->variable_in == -1) {
      this->rebuild_reason = 3;
      return;
    }
    bVar3 = useVariableIn(this);
    if (!bVar3) {
      return;
    }
    if (this->solve_phase == 1) {
      phase1ChooseRow(this);
      if (this->row_out == -1) {
        highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kError,
                    "Primal phase 1 choose row failed\n");
        goto LAB_00344e9d;
      }
    }
    else {
      chooseRow(this);
    }
    considerBoundSwap(this);
    if (this->rebuild_reason != 5) {
      if ((-1 < this->row_out) && (assessPivot(this), this->rebuild_reason != 0)) {
        return;
      }
      bVar3 = isBadBasisChange(this);
      if (!bVar3) {
        update(this);
        pHVar1 = this->ekk_instance_;
        if (((pHVar1->info_).num_primal_infeasibilities == 0) && (this->solve_phase == 1)) {
          this->rebuild_reason = 4;
        }
        else if ((8 < (uint)this->rebuild_reason) ||
                ((0x117U >> (this->rebuild_reason & 0x1fU) & 1) == 0)) {
          printf("HEkkPrimal::rebuild Solve %d; Iter %d: rebuild_reason = %d\n",
                 (ulong)(uint)pHVar1->debug_solve_call_num_,(ulong)(uint)pHVar1->iteration_count_);
          fflush(_stdout);
        }
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::iterate() {
  const HighsInt from_check_iter = 15;
  const HighsInt to_check_iter = from_check_iter + 10;
  if (ekk_instance_.debug_solve_report_) {
    ekk_instance_.debug_iteration_report_ =
        ekk_instance_.iteration_count_ >= from_check_iter &&
        ekk_instance_.iteration_count_ <= to_check_iter;
    if (ekk_instance_.debug_iteration_report_) {
      printf("HEkkDual::iterate Debug iteration %d\n",
             (int)ekk_instance_.iteration_count_);
    }
  }

  if (debugPrimalSimplex("Before iteration") ==
      HighsDebugStatus::kLogicalError) {
    solve_phase = kSolvePhaseError;
    return;
  }
  // Initialise row_out so that aborting iteration before CHUZR due to
  // numerical test of chosen reduced cost can be spotted - and
  // eliminates the unassigned read that can occur when the first
  // iteration is aborted in primal clean-up
  row_out = kNoRowSought;
  // Perform CHUZC
  //
  chuzc();
  if (variable_in == -1) {
    rebuild_reason = kRebuildReasonPossiblyOptimal;
    return;
  }

  // Perform FTRAN - and dual value cross-check to decide whether to use the
  // variable
  //
  // rebuild_reason = kRebuildReasonPossiblySingularBasis is set if
  // numerical trouble is detected
  if (!useVariableIn()) {
    if (rebuild_reason)
      assert(rebuild_reason == kRebuildReasonPossiblySingularBasis);
    return;
  }
  assert(!rebuild_reason);

  // Perform CHUZR
  if (solve_phase == kSolvePhase1) {
    phase1ChooseRow();
    assert(row_out != kNoRowSought);
    if (row_out == kNoRowChosen) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "Primal phase 1 choose row failed\n");
      solve_phase = kSolvePhaseError;
      return;
    }
  } else {
    chooseRow();
  }
  assert(!rebuild_reason);

  // Consider whether to perform a bound swap - either because it's
  // shorter than the pivoting step or, in the case of Phase 1,
  // because it's cheaper than pivoting - which may be questionable
  //
  // rebuild_reason = kRebuildReasonPossiblyPrimalUnbounded is set
  // in phase 2 if there's no pivot or bound swap. In phase 1 there is
  // always a pivot at this stage since row_out < 0 is trapped (above)
  // as an error.
  assert(solve_phase == kSolvePhase2 || row_out >= 0);
  considerBoundSwap();
  if (rebuild_reason == kRebuildReasonPossiblyPrimalUnbounded) return;
  assert(!rebuild_reason);

  if (row_out >= 0) {
    //
    // Perform unit BTRAN and PRICE to get pivotal row - and do a
    // numerical check.
    //
    // rebuild_reason = kRebuildReasonPossiblySingularBasis is set
    // if numerical trouble is detected
    assessPivot();
    if (rebuild_reason) {
      assert(rebuild_reason == kRebuildReasonPossiblySingularBasis);
      return;
    }
  }

  if (isBadBasisChange()) return;

  // Any pivoting is numerically acceptable, so perform update.
  //
  // rebuild_reason =
  // kRebuildReasonPrimalInfeasibleInPrimalSimplex is set if a
  // primal infeasibility is found in phase 2
  //
  // rebuild_reason = kRebuildReasonPossiblyPhase1Feasible is set in
  // phase 1 if the number of primal infeasibilities is reduced to
  // zero
  //
  // rebuild_reason = kRebuildReasonUpdateLimitReached is set in
  // either phase if the update count reaches the limit!
  //
  // rebuild_reason = kRebuildReasonSyntheticClockSaysInvert is
  // set in updateFactor() if it is considered to be more efficient to
  // reinvert.
  update();
  // Force rebuild if there are no infeasibilities in phase 1
  if (!ekk_instance_.info_.num_primal_infeasibilities &&
      solve_phase == kSolvePhase1)
    rebuild_reason = kRebuildReasonPossiblyPhase1Feasible;

  const bool ok_rebuild_reason =
      rebuild_reason == kRebuildReasonNo ||
      rebuild_reason == kRebuildReasonPossiblyPhase1Feasible ||
      rebuild_reason == kRebuildReasonPrimalInfeasibleInPrimalSimplex ||
      rebuild_reason == kRebuildReasonSyntheticClockSaysInvert ||
      rebuild_reason == kRebuildReasonUpdateLimitReached;
  if (!ok_rebuild_reason) {
    printf("HEkkPrimal::rebuild Solve %d; Iter %d: rebuild_reason = %d\n",
           (int)ekk_instance_.debug_solve_call_num_,
           (int)ekk_instance_.iteration_count_, (int)rebuild_reason);
    fflush(stdout);
  }
  assert(ok_rebuild_reason);
  assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
}